

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_keyt.c
# Opt level: O2

err_t bignKeyUnwrap(octet *key,bign_params *params,octet *token,size_t len,octet *header,
                   octet *privkey)

{
  size_t count;
  u64 *dest;
  word *b;
  word *b_00;
  word *b_01;
  size_t n;
  size_t sVar1;
  bool_t bVar2;
  err_t eVar3;
  int iVar4;
  size_t sVar5;
  ec_o *ec;
  void *dest_00;
  word *c;
  word *stack;
  
  bVar2 = memIsValid(params,0x150);
  if (bVar2 == 0) {
    return 0x6d;
  }
  bVar2 = bignIsOperable(params);
  if (bVar2 == 0) {
    return 0x1f6;
  }
  bVar2 = memIsValid(token,len);
  if (bVar2 == 0) {
    return 0x6d;
  }
  if ((header != (octet *)0x0) && (bVar2 = memIsValid(header,0x10), bVar2 == 0)) {
    return 0x6d;
  }
  sVar5 = bignStart_keep(params->l,bignKeyUnwrap_deep);
  ec = (ec_o *)blobCreate(sVar5);
  if (ec == (ec_o *)0x0) {
    return 0x6e;
  }
  eVar3 = bignStart(ec,params);
  if (eVar3 == 0) {
    sVar5 = ec->f->no;
    if (len < sVar5 + 0x20) {
      eVar3 = 0x201;
    }
    else {
      n = ec->f->n;
      bVar2 = memIsValid(privkey,sVar5);
      eVar3 = 0x6d;
      if (bVar2 != 0) {
        count = (len - sVar5) - 0x10;
        bVar2 = memIsValid(key,count);
        if (bVar2 != 0) {
          sVar1 = (ec->hdr).keep;
          dest = (u64 *)((long)&(ec->hdr).keep + sVar1);
          b = dest + n;
          c = b + n * 2;
          b_00 = c + n;
          stack = (word *)((long)&ec->base + sVar1);
          if (0x2f < sVar5 * 5) {
            stack = b_00 + n;
          }
          u64From(dest,privkey,sVar5);
          bVar2 = wwIsZero(dest,n);
          eVar3 = 0x1f8;
          if ((bVar2 == 0) && (iVar4 = wwCmp(dest,ec->order,n), eVar3 = 0x1f8, iVar4 < 0)) {
            bVar2 = (*ec->f->from)(b,token,ec->f,stack);
            if (bVar2 == 0) {
              eVar3 = 0x201;
            }
            else {
              (*ec->f->sqr)(c,b,ec->f,stack);
              zzAddMod(c,c,ec->A,ec->f->mod,ec->f->n);
              (*ec->f->mul)(c,c,b,ec->f,stack);
              zzAddMod(c,c,ec->B,ec->f->mod,ec->f->n);
              b_01 = b + n;
              wwCopy(b_01,ec->f->mod,n);
              zzAddW2(b_01,n,1);
              wwShLo(b_01,n,2);
              qrPower(b_01,c,b_01,n,ec->f,stack);
              (*ec->f->sqr)(b_00,b_01,ec->f,stack);
              bVar2 = wwEq(c,b_00,n);
              if (bVar2 != 0) {
                bVar2 = ecMulA(b,b,ec,dest,n,stack);
                if (bVar2 == 0) {
                  eVar3 = 0x1f6;
                  goto LAB_0012b377;
                }
                dest_00 = (void *)((long)&ec->A + sVar1);
                (*ec->f->to)((octet *)dest,b,ec->f,stack);
                memCopy(key,token + sVar5,count);
                memCopy(dest_00,token + (len - 0x10),0x10);
                beltWBLStart(stack,(octet *)dest,0x20);
                beltWBLStepD2(key,dest_00,len - sVar5,stack);
                if (header == (octet *)0x0) {
                  iVar4 = memIsZero(dest_00,0x10);
                }
                else {
                  iVar4 = memEq(header,dest_00,0x10);
                }
                if (iVar4 != 0) {
                  eVar3 = 0;
                  goto LAB_0012b377;
                }
                memSet(key,'\0',count);
              }
              eVar3 = 0x201;
            }
          }
        }
      }
    }
  }
LAB_0012b377:
  blobClose(ec);
  return eVar3;
}

Assistant:

err_t bignKeyUnwrap(octet key[], const bign_params* params, const octet token[], 
	size_t len, const octet header[16], const octet privkey[])
{
	err_t code;
	size_t no, n;
	// состояние (буферы могут пересекаться)
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* R;				/* [2n] точка R */
	word* t1;				/* [n] вспомогательное число */
	word* t2;				/* [n] вспомогательное число */
	octet* theta;			/* [32] ключ защиты */
	octet* header2;			/* [16] заголовок2 */
	void* stack;			/* граница стека */
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// проверить token и header
	if (!memIsValid(token, len) ||
		!memIsNullOrValid(header, 16))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignKeyUnwrap_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	// проверить длину токена
	if (len < 32 + no)
	{
		blobClose(state);
		return ERR_BAD_KEYTOKEN;
	}
	// проверить входные указатели
	if (!memIsValid(privkey, no) ||
		!memIsValid(key, len - 16 - no))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	R = d + n;
	t1 = R + 2 * n;
	t2 = t1 + n;
	theta = (octet*)d;
	header2 = theta + 32;
	if (5 * no >= 48)
		stack = t2 + n;
	else
		stack = header2 + 16;
	// загрузить d
	wwFrom(d, privkey, no);
	if (wwIsZero(d, n) || wwCmp(d, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// xR <- x
	if (!qrFrom(R, token, ec->f, stack))
	{
		blobClose(state);
		return ERR_BAD_KEYTOKEN;
	}
	// t1 <- x^3 + a x + b
	qrSqr(t1, R, ec->f, stack);
	zmAdd(t1, t1, ec->A, ec->f);
	qrMul(t1, t1, R, ec->f, stack);
	zmAdd(t1, t1, ec->B, ec->f);
	// yR <- t1^{(p + 1) / 4}
	wwCopy(R + n, ec->f->mod, n);
	zzAddW2(R + n, n, 1);
	wwShLo(R + n, n, 2);
	qrPower(R + n, t1, R + n, n, ec->f, stack);
	// t2 <- yR^2
	qrSqr(t2, R + n, ec->f, stack);
	// (xR, yR) на кривой? t1 == t2?
	if (!wwEq(t1, t2, n))
	{
		blobClose(state);
		return ERR_BAD_KEYTOKEN;
	}
	// R <- d R
	if (!ecMulA(R, R, ec, d, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// theta <- <R>_{256}
	qrTo(theta, ecX(R), ec->f, stack);
	// сформировать данные для расшифрования
	memCopy(key, token + no, len - no - 16);
	memCopy(header2, token + len - 16, 16);
	// расшифровать
	beltKWPStart(stack, theta, 32);
	beltKWPStepD2(key, header2, len - no, stack);
	// проверить целостность
	if (header && !memEq(header, header2, 16) ||
		header == 0 && !memIsZero(header2, 16))
	{
		memSetZero(key, len - no - 16);
		code = ERR_BAD_KEYTOKEN;
	}
	// завершение
	blobClose(state);
	return code;
}